

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.cpp
# Opt level: O1

void __thiscall Js::ScriptContextProfiler::~ScriptContextProfiler(ScriptContextProfiler *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  
  this_00 = &this->profilerArena->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  if (this_00 != (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
              (this_00);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_00,0x80);
  }
  if ((this->recycler != (Recycler *)0x0) &&
     (this->backgroundRecyclerProfilerArena != (ArenaAllocator *)0x0)) {
    (**((this->backgroundRecyclerProfilerArena->
        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).super_ArenaData.
       pageAllocator)->_vptr_PageAllocatorBase)();
    Memory::Recycler::ReleaseBackgroundProfilerArena
              (this->recycler,this->backgroundRecyclerProfilerArena);
  }
  return;
}

Assistant:

ScriptContextProfiler::~ScriptContextProfiler()
    {
        if (profilerArena)
        {
            HeapDelete(profilerArena);
        }

        if (recycler && backgroundRecyclerProfilerArena)
        {
#if DBG
            //We are freeing from main thread, disable thread check assert.
            backgroundRecyclerProfilerArena->GetPageAllocator()->SetDisableThreadAccessCheck();
#endif
            recycler->ReleaseBackgroundProfilerArena(backgroundRecyclerProfilerArena);
        }
    }